

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFadds.c
# Opt level: O0

Vec_Int_t * Gia_ManCollectTruthTables(Gia_Man_t *p,Vec_Int_t *vFadds)

{
  int iVar1;
  Vec_Int_t *p_00;
  Vec_Int_t *vTruths;
  int pCut [4];
  int Truth;
  int Type;
  int k;
  int i;
  Vec_Int_t *vFadds_local;
  Gia_Man_t *p_local;
  
  vTruths = (Vec_Int_t *)0x3;
  pCut[0] = 0;
  pCut[1] = 0;
  iVar1 = Vec_IntSize(vFadds);
  p_00 = Vec_IntAlloc((iVar1 << 1) / 5);
  Gia_ManCleanValue(p);
  Type = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vFadds);
    if (iVar1 / 5 <= Type) {
      return p_00;
    }
    for (Truth = 0; Truth < 3; Truth = Truth + 1) {
      iVar1 = Vec_IntEntry(vFadds,Type * 5 + Truth);
      pCut[(long)(Truth + 1) + -2] = iVar1;
    }
    iVar1 = Vec_IntEntry(vFadds,Type * 5 + 3);
    pCut[3] = Dtc_ObjComputeTruth(p,iVar1,(int *)&vTruths,pCut + 2);
    if (pCut[3] != 1) break;
    Vec_IntPush(p_00,pCut[2]);
    iVar1 = Vec_IntEntry(vFadds,Type * 5 + 4);
    pCut[3] = Dtc_ObjComputeTruth(p,iVar1,(int *)&vTruths,pCut + 2);
    if (pCut[3] != 2) {
      __assert_fail("Type == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFadds.c"
                    ,0x200,"Vec_Int_t *Gia_ManCollectTruthTables(Gia_Man_t *, Vec_Int_t *)");
    }
    Vec_IntPush(p_00,pCut[2]);
    Type = Type + 1;
  }
  __assert_fail("Type == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFadds.c"
                ,0x1fd,"Vec_Int_t *Gia_ManCollectTruthTables(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

Vec_Int_t * Gia_ManCollectTruthTables( Gia_Man_t * p, Vec_Int_t * vFadds )
{
    int i, k, Type, Truth, pCut[4] = {3};
    Vec_Int_t * vTruths = Vec_IntAlloc( 2*Vec_IntSize(vFadds)/5 );
    Gia_ManCleanValue( p );
    Dtc_ForEachFadd( vFadds, i )
    {
        for ( k = 0; k < 3; k++ )
            pCut[k+1] = Vec_IntEntry( vFadds, 5*i+k );
        Type = Dtc_ObjComputeTruth( p, Vec_IntEntry(vFadds, 5*i+3), pCut, &Truth );
        assert( Type == 1 );
        Vec_IntPush( vTruths, Truth );
        Type = Dtc_ObjComputeTruth( p, Vec_IntEntry(vFadds, 5*i+4), pCut, &Truth );
        assert( Type == 2 );
        Vec_IntPush( vTruths, Truth );
    }
    return vTruths;
}